

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop.cpp
# Opt level: O2

void ncnn::copy_cut_border_image<float>(Mat *src,Mat *dst,int top,int left)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  void *__dest;
  ulong uVar5;
  void *__src;
  int iVar6;
  
  uVar1 = dst->w;
  iVar2 = src->w;
  __src = (void *)((long)src->data + (long)left * 4 + (long)(top * iVar2) * src->elemsize);
  iVar4 = 0;
  uVar5 = 0;
  if (0 < (int)uVar1) {
    uVar5 = (ulong)uVar1;
  }
  __dest = dst->data;
  iVar6 = dst->h;
  if (dst->h < 1) {
    iVar6 = iVar4;
  }
  for (; iVar4 != iVar6; iVar4 = iVar4 + 1) {
    if ((int)uVar1 < 0xc) {
      for (uVar3 = 0; uVar5 != uVar3; uVar3 = uVar3 + 1) {
        *(undefined4 *)((long)__dest + uVar3 * 4) = *(undefined4 *)((long)__src + uVar3 * 4);
      }
    }
    else {
      memcpy(__dest,__src,(long)(int)uVar1 * 4);
      iVar2 = src->w;
    }
    __dest = (void *)((long)__dest + (long)(int)uVar1 * 4);
    __src = (void *)((long)__src + (long)iVar2 * 4);
  }
  return;
}

Assistant:

static void copy_cut_border_image(const Mat& src, Mat& dst, int top, int left)
{
    int w = dst.w;
    int h = dst.h;

    const T* ptr = src.row<T>(top) + left;
    T* outptr = dst;//.data;

    for (int y = 0; y < h; y++)
    {
        if(w < 12)
        {
            for (int x = 0; x < w; x++)
            {
                outptr[x] = ptr[x];
            }
        }
        else
        {
            memcpy(outptr, ptr, w*sizeof(T));
        }
        outptr += w;
        ptr += src.w;
    }
}